

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Edition2023InferredFeatures_Test::TestBody
          (FeaturesTest_Edition2023InferredFeatures_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  FileDescriptor *file_00;
  FieldDescriptor *pFVar2;
  ConstType pCVar3;
  char *pcVar4;
  AssertHelper local_2b8;
  Message local_2b0;
  FeatureSet local_2a8;
  CppFeatures_StringType local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_2;
  Message local_238;
  FeatureSet local_230;
  CppFeatures_StringType local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  Message local_1c0;
  FeatureSet local_1b8;
  CppFeatures_StringType local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  Descriptor *message;
  FileDescriptor *local_140;
  FileDescriptor *file;
  string_view local_128;
  ParseTextOrDie local_118;
  undefined1 local_108 [8];
  FileDescriptorProto file_proto;
  FeaturesTest_Edition2023InferredFeatures_Test *this_local;
  
  file_proto.field_0._224_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,
             "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    message_type {\n      name: \"Foo\"\n      field { name: \"str\" number: 1 label: LABEL_OPTIONAL type: TYPE_STRING }\n      field {\n        name: \"cord\"\n        number: 2\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options { ctype: CORD }\n      }\n      field {\n        name: \"piece\"\n        number: 3\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options { ctype: STRING_PIECE }\n      }\n      field {\n        name: \"view\"\n        number: 4\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options {\n          features {\n            [pb.cpp] { string_type: VIEW }\n          }\n        }\n      }\n    }\n  "
            );
  ParseTextOrDie::ParseTextOrDie(&local_118,local_128);
  ParseTextOrDie::operator_cast_to_FileDescriptorProto((FileDescriptorProto *)local_108,&local_118);
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  this_00 = pb::CppFeatures::GetDescriptor();
  file_00 = Descriptor::file(this_00);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,file_00);
  message = (Descriptor *)
            DescriptorPool::BuildFile
                      (&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_,
                       (FileDescriptorProto *)local_108);
  local_140 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FileDescriptor_const*>
                        ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                         ,0x21af,"pool_.BuildFile(file_proto)",(FileDescriptor **)&message);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )FileDescriptor::message_type(local_140,0);
  pFVar2 = Descriptor::field((Descriptor *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,0);
  GetCoreFeatures<google::protobuf::FieldDescriptor>(&local_1b8,pFVar2);
  pCVar3 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                     (&local_1b8,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                       *)pb::cpp);
  local_164 = pb::CppFeatures::string_type(pCVar3);
  testing::internal::EqHelper::
  Compare<pb::CppFeatures_StringType,_pb::CppFeatures_StringType,_nullptr>
            ((EqHelper *)local_160,
             "GetCoreFeatures(message->field(0)).GetExtension(pb::cpp).string_type()",
             "pb::CppFeatures::STRING",&local_164,&pb::CppFeatures::STRING);
  FeatureSet::~FeatureSet(&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x21b4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  pFVar2 = Descriptor::field((Descriptor *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,1);
  GetCoreFeatures<google::protobuf::FieldDescriptor>(&local_230,pFVar2);
  pCVar3 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                     (&local_230,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                       *)pb::cpp);
  local_1dc = pb::CppFeatures::string_type(pCVar3);
  testing::internal::EqHelper::
  Compare<pb::CppFeatures_StringType,_pb::CppFeatures_StringType,_nullptr>
            ((EqHelper *)local_1d8,
             "GetCoreFeatures(message->field(1)).GetExtension(pb::cpp).string_type()",
             "pb::CppFeatures::CORD",&local_1dc,&pb::CppFeatures::CORD);
  FeatureSet::~FeatureSet(&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x21b7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  pFVar2 = Descriptor::field((Descriptor *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,3);
  GetCoreFeatures<google::protobuf::FieldDescriptor>(&local_2a8,pFVar2);
  pCVar3 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                     (&local_2a8,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                       *)pb::cpp);
  local_254 = pb::CppFeatures::string_type(pCVar3);
  testing::internal::EqHelper::
  Compare<pb::CppFeatures_StringType,_pb::CppFeatures_StringType,_nullptr>
            ((EqHelper *)local_250,
             "GetCoreFeatures(message->field(3)).GetExtension(pb::cpp).string_type()",
             "pb::CppFeatures::VIEW",&local_254,&pb::CppFeatures::VIEW);
  FeatureSet::~FeatureSet(&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x21ba,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST_F(FeaturesTest, Edition2023InferredFeatures) {
  FileDescriptorProto file_proto = ParseTextOrDie(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    message_type {
      name: "Foo"
      field { name: "str" number: 1 label: LABEL_OPTIONAL type: TYPE_STRING }
      field {
        name: "cord"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { ctype: CORD }
      }
      field {
        name: "piece"
        number: 3
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { ctype: STRING_PIECE }
      }
      field {
        name: "view"
        number: 4
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options {
          features {
            [pb.cpp] { string_type: VIEW }
          }
        }
      }
    }
  )pb");

  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::CppFeatures::GetDescriptor()->file());
  const FileDescriptor* file = ABSL_DIE_IF_NULL(pool_.BuildFile(file_proto));
  const Descriptor* message = file->message_type(0);

  EXPECT_EQ(
      GetCoreFeatures(message->field(0)).GetExtension(pb::cpp).string_type(),
      pb::CppFeatures::STRING);
  EXPECT_EQ(
      GetCoreFeatures(message->field(1)).GetExtension(pb::cpp).string_type(),
      pb::CppFeatures::CORD);
  EXPECT_EQ(
      GetCoreFeatures(message->field(3)).GetExtension(pb::cpp).string_type(),
      pb::CppFeatures::VIEW);
}